

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::baggage::Baggage_testRemoteRestrictionManagerDefaults_Test::TestBody
          (Baggage_testRemoteRestrictionManagerDefaults_Test *this)

{
  bool bVar1;
  type pLVar2;
  type pMVar3;
  duration *rhs;
  char *pcVar4;
  AssertHelper local_2a8 [8];
  Message local_2a0 [15];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  Restriction local_248;
  Restriction local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_220 [8];
  Message local_218 [8];
  duration<long,_std::ratio<1L,_1000000000L>_> local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  RemoteRestrictionManager local_1a0 [8];
  RemoteRestrictionManager manager;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  local_20;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  Baggage_testRemoteRestrictionManagerDefaults_Test *this_local;
  
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"test-service",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"",&local_1e9);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pLVar2 = std::
           unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
           ::operator*((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                        *)&metrics);
  pMVar3 = std::
           unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ::operator*(&local_20);
  jaegertracing::baggage::RemoteRestrictionManager::RemoteRestrictionManager
            (local_1a0,local_1c0,local_1e8,false,(duration *)&gtest_ar.message_,pLVar2,pMVar3);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  local_210.__r = (rep)RemoteRestrictionManager::defaultRefreshInterval();
  rhs = RemoteRestrictionManager::refreshInterval(local_1a0);
  testing::internal::EqHelper<false>::
  Compare<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((EqHelper<false> *)local_208,"RemoteRestrictionManager::defaultRefreshInterval()",
             "manager.refreshInterval()",&local_210,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              (local_220,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=(local_220,local_218);
    testing::internal::AssertHelper::~AssertHelper(local_220);
    testing::Message::~Message(local_218);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    Restriction::Restriction(&local_240,true,0x800);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"test-service",&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"abc",&local_291);
    local_248 = (Restriction)
                jaegertracing::baggage::RemoteRestrictionManager::getRestriction
                          ((string *)local_1a0,local_268);
    testing::internal::EqHelper<false>::
    Compare<jaegertracing::baggage::Restriction,jaegertracing::baggage::Restriction>
              ((EqHelper<false> *)local_238,
               "Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength)",
               "manager.getRestriction(\"test-service\", \"abc\")",&local_240,&local_248);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(local_2a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                (local_2a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/baggage/BaggageTest.cpp"
                 ,0x8a,pcVar4);
      testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
      testing::internal::AssertHelper::~AssertHelper(local_2a8);
      testing::Message::~Message(local_2a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  RemoteRestrictionManager::~RemoteRestrictionManager(local_1a0);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
               *)&metrics);
  return;
}

Assistant:

TEST(Baggage, testRemoteRestrictionManagerDefaults)
{
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    RemoteRestrictionManager manager(
        "test-service",
        "",
        false,
        RemoteRestrictionManager::Clock::duration(),
        *logger,
        *metrics);
    ASSERT_EQ(RemoteRestrictionManager::defaultRefreshInterval(),
              manager.refreshInterval());
    ASSERT_EQ(
        Restriction(true, RemoteRestrictionManager::kDefaultMaxValueLength),
        manager.getRestriction("test-service", "abc"));
}